

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::BlendTest::createInstance(BlendTest *this,Context *context)

{
  Context **__s;
  Context **ppCVar1;
  TestInstance *pTVar2;
  TestInstance *pTVar3;
  VkAttachmentStoreOp *pVVar4;
  VkFormat VVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  VkRenderPass obj;
  VkFramebuffer obj_00;
  VkShaderModule VVar9;
  _func_int **pp_Var10;
  VkCommandPool obj_01;
  VkFence obj_02;
  undefined8 uVar11;
  bool bVar12;
  VkResult VVar13;
  TestInstance *pTVar14;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *pIVar15;
  VkPhysicalDevice pVVar16;
  const_iterator cVar17;
  NotSupportedError *this_00;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  size_type *psVar21;
  int i;
  Context *pCVar22;
  VkPipelineColorBlendAttachmentState *pVVar23;
  TestInstance *pTVar24;
  long lVar25;
  Context **ppCVar26;
  byte bVar27;
  deUint32 queueFamilyIndex;
  VkRenderPassCreateInfo renderPassParams;
  VkAttachmentDescription colorAttachmentDescription;
  undefined4 uStack_6b4;
  undefined1 local_638 [16];
  undefined8 local_628;
  VkCommandPool VStack_620;
  VkPipelineColorBlendAttachmentState *local_618;
  float local_610 [4];
  Context **local_600;
  Move<vk::Handle<(vk::HandleType)18>_> local_5f8;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentReference local_5d0;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkFormatProperties formatProps;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  undefined8 local_548;
  Context *pCStack_540;
  VkPipelineTessellationStateCreateInfo *pVStack_538;
  VkPipelineViewportStateCreateInfo *pVStack_530;
  VkPipelineRasterizationStateCreateInfo *pVStack_528;
  VkPipelineMultisampleStateCreateInfo *local_520;
  VkPipelineDepthStencilStateCreateInfo *local_518;
  VkPipelineColorBlendStateCreateInfo *local_510;
  VkPipelineDynamicStateCreateInfo *local_508;
  VkPipelineLayout local_500;
  VkRenderPass local_4f8;
  deUint32 local_4f0;
  VkPipeline local_4e8;
  deUint32 local_4e0;
  _func_int **local_358;
  Context *pCStack_350;
  VkDevice local_348;
  VkAllocationCallbacks *pVStack_340;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  SimpleAllocator memAlloc;
  
  bVar27 = 0;
  pTVar14 = (TestInstance *)operator_new(0x310);
  VVar5 = this->m_colorFormat;
  pTVar14->m_context = context;
  pTVar14->_vptr_TestInstance = (_func_int **)&PTR__BlendTestInstance_00d56298;
  pTVar14[9]._vptr_TestInstance = (_func_int **)0x2000000020;
  *(VkFormat *)&pTVar14[9].m_context = VVar5;
  ppCVar26 = &pTVar14[0xf].m_context;
  __s = &pTVar14[0x12].m_context;
  ppCVar1 = &pTVar14[0x1c].m_context;
  local_600 = &pTVar14[0x1e].m_context;
  pTVar2 = pTVar14 + 0x21;
  pTVar14[0x10].m_context = (Context *)0x0;
  pTVar14[0x11]._vptr_TestInstance = (_func_int **)0x0;
  pTVar14[0xf].m_context = (Context *)0x0;
  pTVar14[0x10]._vptr_TestInstance = (_func_int **)0x0;
  pTVar14[0x11].m_context = (Context *)0x0;
  memset(__s,0,0xe0);
  pTVar3 = pTVar14 + 0x2d;
  memset(pTVar2,0,0x100);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(pTVar14->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(pTVar14->m_context);
  pIVar15 = Context::getInstanceInterface(pTVar14->m_context);
  pVVar16 = Context::getPhysicalDevice(pTVar14->m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&formatProps,pIVar15,pVVar16);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&formatProps);
  pVVar23 = this->m_blendStates;
  pTVar24 = pTVar14 + 1;
  for (lVar19 = 0x20; lVar19 != 0; lVar19 = lVar19 + -1) {
    *(VkBool32 *)&pTVar24->_vptr_TestInstance = pVVar23->blendEnable;
    pVVar23 = (VkPipelineColorBlendAttachmentState *)((long)pVVar23 + (ulong)bVar27 * -8 + 4);
    pTVar24 = (TestInstance *)((long)pTVar24 + (ulong)bVar27 * -8 + 4);
  }
  pIVar15 = Context::getInstanceInterface(context);
  pVVar16 = Context::getPhysicalDevice(context);
  (*pIVar15->_vptr_InstanceInterface[3])
            (pIVar15,pVVar16,(ulong)*(uint *)&pTVar14[9].m_context,&formatProps);
  if ((~formatProps.optimalTilingFeatures & 0x180) == 0) {
    uVar6 = *(undefined4 *)&pTVar14[9].m_context;
    uVar7 = *(undefined4 *)&pTVar14[9]._vptr_TestInstance;
    uVar8 = *(undefined4 *)((long)&pTVar14[9]._vptr_TestInstance + 4);
    *(undefined4 *)&pTVar14[10]._vptr_TestInstance = 0xe;
    pTVar14[10].m_context = (Context *)0x0;
    pTVar14[0xb]._vptr_TestInstance = (_func_int **)0x100000000;
    *(undefined4 *)&pTVar14[0xb].m_context = uVar6;
    *(undefined4 *)((long)&pTVar14[0xb].m_context + 4) = uVar7;
    *(undefined4 *)&pTVar14[0xc]._vptr_TestInstance = uVar8;
    *(undefined8 *)((long)&pTVar14[0xc]._vptr_TestInstance + 4) = 0x100000001;
    *(undefined8 *)((long)&pTVar14[0xc].m_context + 4) = 0x100000001;
    *(undefined8 *)((long)&pTVar14[0xd]._vptr_TestInstance + 4) = 0x1100000000;
    *(undefined8 *)((long)&pTVar14[0xd].m_context + 4) = 0x100000000;
    pTVar14[0xe].m_context = (Context *)&queueFamilyIndex;
    *(undefined4 *)&pTVar14[0xf]._vptr_TestInstance = 0;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&renderPassParams,vk,device,
                      (VkImageCreateInfo *)(pTVar14 + 10),(VkAllocationCallbacks *)0x0);
    local_558._M_allocated_capacity._0_4_ = renderPassParams.flags;
    local_558._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
    local_558._8_8_ = renderPassParams.pAttachments;
    formatProps.linearTilingFeatures = renderPassParams.sType;
    formatProps.optimalTilingFeatures = renderPassParams._4_4_;
    stack0xfffffffffffffaa0 = (Context *)renderPassParams.pNext;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    if (*ppCVar26 != (Context *)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(pTVar14 + 0x10),(VkImage)*ppCVar26);
    }
    pTVar14[0x10].m_context = (Context *)local_558._M_allocated_capacity;
    pTVar14[0x11]._vptr_TestInstance = (_func_int **)local_558._8_8_;
    *ppCVar26 = (Context *)formatProps._0_8_;
    pTVar14[0x10]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffaa0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&renderPassParams.pNext,
                 (VkImage)renderPassParams._0_8_);
    }
    ::vk::getImageMemoryRequirements
              ((VkMemoryRequirements *)&formatProps,vk,device,(VkImage)*ppCVar26);
    ::vk::SimpleAllocator::allocate
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&renderPassParams,
               &memAlloc,(VkMemoryRequirements *)&formatProps,(MemoryRequirement)0x0);
    uVar11 = renderPassParams._0_8_;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    pCVar22 = pTVar14[0x11].m_context;
    if (pCVar22 != (Context *)uVar11) {
      if (pCVar22 != (Context *)0x0) {
        (*(code *)pCVar22->m_testCtx->m_rootArchive)();
        pTVar14[0x11].m_context = (Context *)0x0;
      }
      pTVar14[0x11].m_context = (Context *)uVar11;
    }
    if (renderPassParams._0_8_ != 0) {
      (**(code **)(*(long *)renderPassParams._0_8_ + 8))();
      renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      renderPassParams._4_4_ = 0;
    }
    VVar13 = (*vk->_vptr_DeviceInterface[0xd])
                       (vk,device,pTVar14[0xf].m_context,
                        (pTVar14[0x11].m_context)->m_platformInterface);
    ::vk::checkResult(VVar13,
                      "vk.bindImageMemory(vkDevice, *m_colorImage, m_colorImageAlloc->getMemory(), m_colorImageAlloc->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                      ,0x153);
    formatProps.linearTilingFeatures = 0xf;
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_558._M_allocated_capacity = local_558._M_allocated_capacity & 0xffffffff00000000;
    local_558._8_8_ = pTVar14[0xf].m_context;
    local_548 = (VkPipelineVertexInputStateCreateInfo *)
                CONCAT44(*(VkMemoryPropertyFlags *)&pTVar14[9].m_context,1);
    pCStack_540 = (Context *)0x0;
    pVStack_538 = (VkPipelineTessellationStateCreateInfo *)0x0;
    pVStack_530 = (VkPipelineViewportStateCreateInfo *)&DAT_00000001;
    pVStack_528 = (VkPipelineRasterizationStateCreateInfo *)&DAT_00000001;
    local_520 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_520._4_4_,1);
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentDescription,vk,device,
               (VkImageViewCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
    renderPassParams.flags = colorAttachmentDescription.storeOp;
    renderPassParams.attachmentCount = colorAttachmentDescription.stencilLoadOp;
    renderPassParams.pAttachments = (VkAttachmentDescription *)colorAttachmentDescription._24_8_;
    renderPassParams.sType = colorAttachmentDescription.flags;
    renderPassParams._4_4_ = colorAttachmentDescription.format;
    renderPassParams.pNext = (void *)colorAttachmentDescription._8_8_;
    colorAttachmentDescription.flags = 0;
    colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    colorAttachmentDescription.samples = 0;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    if (*__s != (Context *)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(pTVar14 + 0x13),(VkImageView)*__s);
    }
    pTVar14[0x13].m_context = (Context *)renderPassParams._16_8_;
    pTVar14[0x14]._vptr_TestInstance = (_func_int **)renderPassParams.pAttachments;
    *__s = (Context *)renderPassParams._0_8_;
    pTVar14[0x13]._vptr_TestInstance = (_func_int **)renderPassParams.pNext;
    if (colorAttachmentDescription._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentDescription.samples,
                 (VkImageView)colorAttachmentDescription._0_8_);
    }
    colorAttachmentDescription._0_8_ = (ulong)*(uint *)&pTVar14[9].m_context << 0x20;
    colorAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
    colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
    colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
    stack0xfffffffffffff948 = (char *)CONCAT44(uStack_6b4,2);
    local_548 = (VkPipelineVertexInputStateCreateInfo *)&colorAttachmentReference;
    local_5d0 = colorAttachmentReference;
    colorAttachmentReference.attachment = 0;
    colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
    local_558._M_allocated_capacity = 0;
    pCStack_540 = (Context *)0x0;
    pVStack_528 = (VkPipelineRasterizationStateCreateInfo *)0x0;
    pVStack_538 = (VkPipelineTessellationStateCreateInfo *)0x0;
    pVStack_530 = (VkPipelineViewportStateCreateInfo *)0x0;
    formatProps.linearTilingFeatures = 0;
    formatProps.optimalTilingFeatures = 0;
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_558._8_8_ = 1;
    renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 1;
    renderPassParams.subpassCount = 1;
    renderPassParams._48_8_ = (ulong)(uint)renderPassParams._52_4_ << 0x20;
    renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
    renderPassParams.pAttachments = &colorAttachmentDescription;
    renderPassParams.pSubpasses = (VkSubpassDescription *)&formatProps;
    ::vk::createRenderPass
              ((Move<vk::Handle<(vk::HandleType)17>_> *)local_638,vk,device,&renderPassParams,
               (VkAllocationCallbacks *)0x0);
    rasterStateParams._16_8_ = local_628;
    rasterStateParams.rasterizerDiscardEnable = (VkLogicOp)VStack_620.m_internal;
    rasterStateParams.polygonMode = VStack_620.m_internal._4_4_;
    rasterStateParams._0_8_ = local_638._0_8_;
    rasterStateParams.pNext = (void *)local_638._8_8_;
    local_638._0_8_ = 0;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)0x0;
    VStack_620.m_internal = 0;
    obj.m_internal = (deUint64)pTVar14[0x14].m_context;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(pTVar14 + 0x15),obj);
    }
    pTVar14[0x15].m_context = (Context *)rasterStateParams._16_8_;
    pTVar14[0x16]._vptr_TestInstance = (_func_int **)rasterStateParams._24_8_;
    pTVar14[0x14].m_context = (Context *)rasterStateParams._0_8_;
    pTVar14[0x15]._vptr_TestInstance = (_func_int **)rasterStateParams.pNext;
    if (local_638._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(local_638 + 8),
                 (VkRenderPass)local_638._0_8_);
    }
    formatProps.linearTilingFeatures = 0x25;
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_558._M_allocated_capacity = local_558._M_allocated_capacity & 0xffffffff00000000;
    local_558._8_8_ = pTVar14[0x14].m_context;
    local_548 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_548._4_4_,1);
    pVStack_538 = (VkPipelineTessellationStateCreateInfo *)pTVar14[9]._vptr_TestInstance;
    pVStack_530 = (VkPipelineViewportStateCreateInfo *)CONCAT44(pVStack_530._4_4_,1);
    pCStack_540 = (Context *)__s;
    ::vk::createFramebuffer
              ((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentDescription,vk,device,
               (VkFramebufferCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
    renderPassParams.flags = colorAttachmentDescription.storeOp;
    renderPassParams.attachmentCount = colorAttachmentDescription.stencilLoadOp;
    renderPassParams.pAttachments = (VkAttachmentDescription *)colorAttachmentDescription._24_8_;
    renderPassParams.sType = colorAttachmentDescription.flags;
    renderPassParams._4_4_ = colorAttachmentDescription.format;
    renderPassParams.pNext = (void *)colorAttachmentDescription._8_8_;
    colorAttachmentDescription.flags = 0;
    colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    colorAttachmentDescription.samples = 0;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    obj_00.m_internal = (deUint64)pTVar14[0x16].m_context;
    if (obj_00.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(pTVar14 + 0x17),obj_00);
    }
    pTVar14[0x17].m_context = (Context *)renderPassParams._16_8_;
    pTVar14[0x18]._vptr_TestInstance = (_func_int **)renderPassParams.pAttachments;
    pTVar14[0x16].m_context = (Context *)renderPassParams._0_8_;
    pTVar14[0x17]._vptr_TestInstance = (_func_int **)renderPassParams.pNext;
    if (colorAttachmentDescription._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentDescription.samples,
                 (VkFramebuffer)colorAttachmentDescription._0_8_);
    }
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_548 = (VkPipelineVertexInputStateCreateInfo *)0x0;
    pCStack_540 = (Context *)0x0;
    local_558._M_allocated_capacity = 0;
    local_558._8_8_ = 0;
    formatProps.linearTilingFeatures = 0x1e;
    formatProps.optimalTilingFeatures = 0;
    ::vk::createPipelineLayout
              ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentDescription,vk,device,
               (VkPipelineLayoutCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
    renderPassParams.flags = colorAttachmentDescription.storeOp;
    renderPassParams.attachmentCount = colorAttachmentDescription.stencilLoadOp;
    renderPassParams.pAttachments = (VkAttachmentDescription *)colorAttachmentDescription._24_8_;
    renderPassParams.sType = colorAttachmentDescription.flags;
    renderPassParams._4_4_ = colorAttachmentDescription.format;
    renderPassParams.pNext = (void *)colorAttachmentDescription._8_8_;
    colorAttachmentDescription.flags = 0;
    colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    colorAttachmentDescription.samples = 0;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    if (pTVar2->_vptr_TestInstance != (_func_int **)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&pTVar14[0x21].m_context,
                 (VkPipelineLayout)pTVar2->_vptr_TestInstance);
    }
    pTVar14[0x22]._vptr_TestInstance = (_func_int **)renderPassParams._16_8_;
    pTVar14[0x22].m_context = (Context *)renderPassParams.pAttachments;
    pTVar2->_vptr_TestInstance = (_func_int **)renderPassParams._0_8_;
    pTVar14[0x21].m_context = (Context *)renderPassParams.pNext;
    if (colorAttachmentDescription._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentDescription.samples,
                 (VkPipelineLayout)colorAttachmentDescription._0_8_);
    }
    pVVar4 = &colorAttachmentDescription.storeOp;
    colorAttachmentDescription.storeOp = 0x6f6c6f63;
    colorAttachmentDescription.stencilLoadOp = 0x65765f72;
    colorAttachmentDescription.samples = VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_2_BIT;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.stencilStoreOp._0_3_ = 0x7472;
    colorAttachmentDescription._0_8_ = pVVar4;
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)pTVar14->m_context->m_progCollection,(key_type *)&colorAttachmentDescription)
    ;
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams,vk,device,
               *(ProgramBinary **)(cVar17._M_node + 2),0);
    local_558._M_allocated_capacity._0_4_ = renderPassParams.flags;
    local_558._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
    local_558._8_8_ = renderPassParams.pAttachments;
    formatProps.linearTilingFeatures = renderPassParams.sType;
    formatProps.optimalTilingFeatures = renderPassParams._4_4_;
    stack0xfffffffffffffaa0 = (Context *)renderPassParams.pNext;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    VVar9.m_internal = (deUint64)pTVar14[0x18].m_context;
    if (VVar9.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(pTVar14 + 0x19),VVar9);
    }
    pTVar14[0x19].m_context = (Context *)local_558._M_allocated_capacity;
    pTVar14[0x1a]._vptr_TestInstance = (_func_int **)local_558._8_8_;
    pTVar14[0x18].m_context = (Context *)formatProps._0_8_;
    pTVar14[0x19]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffaa0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams.pNext,
                 (VkShaderModule)renderPassParams._0_8_);
    }
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar4) {
      operator_delete((void *)colorAttachmentDescription._0_8_,colorAttachmentDescription._16_8_ + 1
                     );
    }
    colorAttachmentDescription.storeOp = 0x6f6c6f63;
    colorAttachmentDescription.stencilLoadOp = 0x72665f72;
    colorAttachmentDescription.samples = VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_2_BIT;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.stencilStoreOp._0_3_ = 0x6761;
    colorAttachmentDescription._0_8_ = pVVar4;
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                     *)pTVar14->m_context->m_progCollection,(key_type *)&colorAttachmentDescription)
    ;
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams,vk,device,
               *(ProgramBinary **)(cVar17._M_node + 2),0);
    local_558._M_allocated_capacity._0_4_ = renderPassParams.flags;
    local_558._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
    local_558._8_8_ = renderPassParams.pAttachments;
    formatProps.linearTilingFeatures = renderPassParams.sType;
    formatProps.optimalTilingFeatures = renderPassParams._4_4_;
    stack0xfffffffffffffaa0 = (Context *)renderPassParams.pNext;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    VVar9.m_internal = (deUint64)pTVar14[0x1a].m_context;
    if (VVar9.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(pTVar14 + 0x1b),VVar9);
    }
    pTVar14[0x1b].m_context = (Context *)local_558._M_allocated_capacity;
    pTVar14[0x1c]._vptr_TestInstance = (_func_int **)local_558._8_8_;
    pTVar14[0x1a].m_context = (Context *)formatProps._0_8_;
    pTVar14[0x1b]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffaa0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams.pNext,
                 (VkShaderModule)renderPassParams._0_8_);
    }
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != pVVar4) {
      operator_delete((void *)colorAttachmentDescription._0_8_,colorAttachmentDescription._16_8_ + 1
                     );
    }
    colorAttachmentDescription.flags = 0x12;
    colorAttachmentDescription.samples = 0;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
    colorAttachmentDescription._24_8_ = pTVar14[0x18].m_context;
    stack0xfffffffffffff948 = "main";
    vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
    vertexInputBindingDescription.binding = 0;
    vertexInputBindingDescription.stride = 0x20;
    colorAttachmentReference.attachment = 0x13;
    local_5d0 = (VkAttachmentReference)0x0;
    pCStack_540 = (Context *)&inputAssemblyStateParams;
    inputAssemblyStateParams.flags = 0;
    inputAssemblyStateParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    inputAssemblyStateParams.primitiveRestartEnable = 0;
    inputAssemblyStateParams._28_4_ = 0;
    inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
    inputAssemblyStateParams._4_4_ = 0;
    inputAssemblyStateParams.pNext = (void *)0x0;
    viewportStateParams.pViewports = &viewport;
    viewport.x = 0.0;
    viewport.y = 0.0;
    scissor.extent.width = *(deUint32 *)&pTVar14[9]._vptr_TestInstance;
    viewport.width = (float)scissor.extent.width;
    scissor.extent.height = *(uint *)((long)&pTVar14[9]._vptr_TestInstance + 4);
    viewport.height = (float)scissor.extent.height;
    viewport.minDepth = 0.0;
    viewport.maxDepth = 1.0;
    viewportStateParams.pScissors = &scissor;
    scissor.offset.x = 0;
    scissor.offset.y = 0;
    pVStack_530 = &viewportStateParams;
    viewportStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
    viewportStateParams.pNext = (void *)0x0;
    viewportStateParams.flags = 0;
    viewportStateParams.viewportCount = 1;
    viewportStateParams.scissorCount = 1;
    pVStack_528 = &rasterStateParams;
    rasterStateParams.pNext = (void *)0x0;
    rasterStateParams.depthBiasClamp = 0.0;
    rasterStateParams.depthBiasSlopeFactor = 0.0;
    rasterStateParams.cullMode = 0;
    rasterStateParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
    rasterStateParams.depthBiasEnable = 0;
    rasterStateParams.depthBiasConstantFactor = 0.0;
    rasterStateParams.flags = 0;
    rasterStateParams.depthClampEnable = 0;
    rasterStateParams.rasterizerDiscardEnable = 0;
    rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
    rasterStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
    rasterStateParams._4_4_ = 0;
    rasterStateParams.lineWidth = 1.0;
    rasterStateParams._60_4_ = 0;
    local_520 = &multisampleStateParams;
    multisampleStateParams.pNext = (void *)0x0;
    multisampleStateParams.sampleShadingEnable = 0;
    multisampleStateParams.minSampleShading = 0.0;
    multisampleStateParams.pSampleMask = (VkSampleMask *)0x0;
    multisampleStateParams.alphaToCoverageEnable = 0;
    multisampleStateParams.alphaToOneEnable = 0;
    multisampleStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
    multisampleStateParams._4_4_ = 0;
    multisampleStateParams.flags = 0;
    multisampleStateParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.dependencyCount = 0;
    renderPassParams._52_4_ = 0;
    renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
    renderPassParams.subpassCount = 0;
    renderPassParams._36_4_ = 0;
    renderPassParams.pSubpasses = (VkSubpassDescription *)0x0;
    renderPassParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x100000000;
    local_638._0_4_ = 0x1a;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)0x0;
    VStack_620.m_internal = 3;
    local_610[0] = 0.1;
    local_610[1] = 0.2;
    local_610[2] = 0.3;
    local_610[3] = 0.4;
    formatProps.linearTilingFeatures = 0x1c;
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_558._M_allocated_capacity = 0x200000000;
    local_548 = (VkPipelineVertexInputStateCreateInfo *)&colorAttachmentReference;
    pVStack_538 = (VkPipelineTessellationStateCreateInfo *)0x0;
    local_510 = (VkPipelineColorBlendStateCreateInfo *)local_638;
    local_508 = (VkPipelineDynamicStateCreateInfo *)0x0;
    local_500.m_internal = (deUint64)pTVar14[0x21]._vptr_TestInstance;
    local_4f8.m_internal = (deUint64)pTVar14[0x14].m_context;
    local_4f0 = 0;
    local_4e8.m_internal = 0;
    local_4e0 = 0;
    pTVar2 = pTVar14 + 0x23;
    lVar19 = 4;
    local_558._8_8_ = &colorAttachmentDescription;
    local_518 = (VkPipelineDepthStencilStateCreateInfo *)&renderPassParams;
    do {
      ppCVar26 = &pTVar2->m_context;
      VStack_620.m_internal._4_4_ = 1;
      local_618 = (VkPipelineColorBlendAttachmentState *)(ppCVar26 + -0x45);
      ::vk::createGraphicsPipeline
                (&local_5f8,vk,device,(VkPipelineCache)0x0,
                 (VkGraphicsPipelineCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
      local_348 = local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      pVStack_340 = local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                    m_allocator;
      local_358 = (_func_int **)
                  local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      pCStack_350 = (Context *)
                    local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                    m_deviceIface;
      local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (((TestInstance *)(ppCVar26 + -1))->_vptr_TestInstance != (_func_int **)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)18>_> *)ppCVar26,
                   (VkPipeline)((TestInstance *)(ppCVar26 + -1))->_vptr_TestInstance);
      }
      ppCVar26[1] = (Context *)local_348;
      ppCVar26[2] = (Context *)pVStack_340;
      ((TestInstance *)(ppCVar26 + -1))->_vptr_TestInstance = local_358;
      *ppCVar26 = pCStack_350;
      if (local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                   (VkPipeline)
                   local_5f8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
                  );
      }
      pTVar2 = (TestInstance *)(ppCVar26 + 3);
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
    renderPassParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams._16_8_ = renderPassParams._16_8_ & 0xffffffff00000000;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x400;
    renderPassParams.subpassCount = 0x80;
    renderPassParams._36_4_ = 0;
    renderPassParams.pSubpasses =
         (VkSubpassDescription *)CONCAT44(renderPassParams.pSubpasses._4_4_,1);
    renderPassParams._48_8_ = &queueFamilyIndex;
    createOverlappingQuads();
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
    _M_move_assign((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)local_600,&formatProps);
    if (formatProps._0_8_ != 0) {
      operator_delete((void *)formatProps._0_8_,local_558._M_allocated_capacity - formatProps._0_8_)
      ;
    }
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&colorAttachmentDescription,vk,device
                       ,(VkBufferCreateInfo *)&renderPassParams,(VkAllocationCallbacks *)0x0);
    local_558._M_allocated_capacity._0_4_ = colorAttachmentDescription.storeOp;
    local_558._M_allocated_capacity._4_4_ = colorAttachmentDescription.stencilLoadOp;
    local_558._8_4_ = colorAttachmentDescription.stencilStoreOp;
    local_558._12_4_ = colorAttachmentDescription.initialLayout;
    formatProps.linearTilingFeatures = colorAttachmentDescription.flags;
    formatProps.optimalTilingFeatures = colorAttachmentDescription.format;
    stack0xfffffffffffffaa0 = (Context *)colorAttachmentDescription._8_8_;
    colorAttachmentDescription.flags = 0;
    colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    colorAttachmentDescription.samples = 0;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
    colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
    colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    if (*ppCVar1 != (Context *)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(pTVar14 + 0x1d),(VkBuffer)*ppCVar1);
    }
    pTVar14[0x1d].m_context = (Context *)local_558._M_allocated_capacity;
    pTVar14[0x1e]._vptr_TestInstance = (_func_int **)local_558._8_8_;
    *ppCVar1 = (Context *)formatProps._0_8_;
    pTVar14[0x1d]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffaa0;
    if (colorAttachmentDescription._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&colorAttachmentDescription.samples,
                 (VkBuffer)colorAttachmentDescription._0_8_);
    }
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)&formatProps,vk,device,(VkBuffer)*ppCVar1);
    ::vk::SimpleAllocator::allocate
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &colorAttachmentDescription,&memAlloc,(VkMemoryRequirements *)&formatProps,
               (MemoryRequirement)0x1);
    uVar11 = colorAttachmentDescription._0_8_;
    colorAttachmentDescription.flags = 0;
    colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    pp_Var10 = pTVar14[0x20]._vptr_TestInstance;
    if (pp_Var10 != (_func_int **)uVar11) {
      if (pp_Var10 != (_func_int **)0x0) {
        (**(code **)(*pp_Var10 + 8))();
        pTVar14[0x20]._vptr_TestInstance = (_func_int **)0x0;
      }
      pTVar14[0x20]._vptr_TestInstance = (_func_int **)uVar11;
    }
    if (colorAttachmentDescription._0_8_ != 0) {
      (**(code **)(*(long *)colorAttachmentDescription._0_8_ + 8))();
      colorAttachmentDescription.flags = 0;
      colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    }
    VVar13 = (*vk->_vptr_DeviceInterface[0xc])
                       (vk,device,pTVar14[0x1c].m_context,pTVar14[0x20]._vptr_TestInstance[1],
                        pTVar14[0x20]._vptr_TestInstance[2]);
    ::vk::checkResult(VVar13,
                      "vk.bindBufferMemory(vkDevice, *m_vertexBuffer, m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                      ,0x29c);
    bVar12 = ::vk::isFloatFormat(*(VkFormat *)&pTVar14[9].m_context);
    if (!bVar12) {
      colorAttachmentDescription._0_8_ = ::vk::mapVkFormat(*(VkFormat *)&pTVar14[9].m_context);
      tcu::getTextureFormatInfo
                ((TextureFormatInfo *)&formatProps,(TextureFormat *)&colorAttachmentDescription);
      pCVar22 = pTVar14[0x1e].m_context;
      if ((Context *)pTVar14[0x1f]._vptr_TestInstance != pCVar22) {
        lVar19 = 0x10;
        uVar20 = 0;
        do {
          rasterStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          rasterStateParams._4_4_ = 0;
          rasterStateParams.pNext = (void *)0x0;
          lVar25 = 0;
          do {
            (&rasterStateParams.sType)[lVar25] =
                 (VkStructureType)
                 (*(float *)((long)&pCVar22->m_testCtx + lVar25 * 4 + lVar19) -
                 *(float *)((long)&pVStack_538 + lVar25 * 4));
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          colorAttachmentDescription.flags = 0;
          colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
          colorAttachmentDescription.samples = 0;
          colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
          lVar25 = 0;
          do {
            (&colorAttachmentDescription.flags)[lVar25] =
                 (VkAttachmentDescriptionFlags)
                 ((float)(&rasterStateParams.sType)[lVar25] /
                 *(float *)((long)&local_548 + lVar25 * 4));
            lVar25 = lVar25 + 1;
          } while (lVar25 != 4);
          (&pCVar22->m_progCollection)[uVar20 * 4] =
               (ProgramCollection<vk::ProgramBinary> *)colorAttachmentDescription._0_8_;
          (&pCVar22->m_device)[uVar20 * 2].
          super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.ptr =
               (DefaultDevice *)colorAttachmentDescription._8_8_;
          uVar20 = uVar20 + 1;
          pCVar22 = pTVar14[0x1e].m_context;
          lVar19 = lVar19 + 0x20;
        } while (uVar20 < (ulong)((long)pTVar14[0x1f]._vptr_TestInstance - (long)pCVar22 >> 5));
      }
    }
    memcpy(pTVar14[0x20]._vptr_TestInstance[3],pTVar14[0x1e].m_context,
           (long)pTVar14[0x1f]._vptr_TestInstance - (long)pTVar14[0x1e].m_context);
    formatProps.linearTilingFeatures = 6;
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_558._M_allocated_capacity = (size_type)pTVar14[0x20]._vptr_TestInstance[1];
    local_558._8_8_ = pTVar14[0x20]._vptr_TestInstance[2];
    local_548 = (VkPipelineVertexInputStateCreateInfo *)renderPassParams.pAttachments;
    (*vk->_vptr_DeviceInterface[9])(vk,device,1,&formatProps);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&renderPassParams,vk,device,1,
               queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    local_558._M_allocated_capacity._0_4_ = renderPassParams.flags;
    local_558._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
    local_558._8_8_ = renderPassParams.pAttachments;
    formatProps.linearTilingFeatures = renderPassParams.sType;
    formatProps.optimalTilingFeatures = renderPassParams._4_4_;
    stack0xfffffffffffffaa0 = (Context *)renderPassParams.pNext;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    obj_01.m_internal = (deUint64)pTVar14[0x2b]._vptr_TestInstance;
    if (obj_01.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&pTVar14[0x2b].m_context,obj_01);
    }
    pTVar14[0x2c]._vptr_TestInstance = (_func_int **)local_558._M_allocated_capacity;
    pTVar14[0x2c].m_context = (Context *)local_558._8_8_;
    pTVar14[0x2b]._vptr_TestInstance = (_func_int **)formatProps._0_8_;
    pTVar14[0x2b].m_context = stack0xfffffffffffffaa0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&renderPassParams.pNext,
                 (VkCommandPool)renderPassParams._0_8_);
    }
    rasterStateParams.flags = 0;
    rasterStateParams.depthClampEnable = 0;
    rasterStateParams.rasterizerDiscardEnable = 0;
    rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
    rasterStateParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    rasterStateParams._4_4_ = 0;
    rasterStateParams.pNext = (void *)0x0;
    _colorAttachmentReference = defaultClearValue(*(VkFormat *)&pTVar14[9].m_context);
    renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams._16_8_ = pTVar14[0x14].m_context;
    renderPassParams.pAttachments = (VkAttachmentDescription *)pTVar14[0x16].m_context;
    renderPassParams.subpassCount = 0;
    renderPassParams._36_4_ = 0;
    renderPassParams.pSubpasses = (VkSubpassDescription *)pTVar14[9]._vptr_TestInstance;
    renderPassParams.dependencyCount = 1;
    renderPassParams.pDependencies = (VkSubpassDependency *)&colorAttachmentReference;
    formatProps.linearTilingFeatures = 0x2d;
    stack0xfffffffffffffaa0 = (Context *)0x0;
    local_558._M_allocated_capacity = 0x10000000000;
    local_558._8_8_ = 0x200000000;
    local_548 = (VkPipelineVertexInputStateCreateInfo *)0xffffffffffffffff;
    pCStack_540 = pTVar14[0xf].m_context;
    pVStack_538 = (VkPipelineTessellationStateCreateInfo *)&DAT_00000001;
    pVStack_530 = (VkPipelineViewportStateCreateInfo *)&DAT_00000001;
    pVStack_528 = (VkPipelineRasterizationStateCreateInfo *)CONCAT44(pVStack_528._4_4_,1);
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_638,vk,device,
               (VkCommandPool)pTVar14[0x2b]._vptr_TestInstance,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    colorAttachmentDescription.storeOp = (VkAttachmentStoreOp)local_628;
    colorAttachmentDescription.stencilLoadOp = local_628._4_4_;
    colorAttachmentDescription.stencilStoreOp = (VkAttachmentStoreOp)VStack_620.m_internal;
    colorAttachmentDescription.initialLayout = VStack_620.m_internal._4_4_;
    colorAttachmentDescription.flags = local_638._0_4_;
    colorAttachmentDescription.format = local_638._4_4_;
    colorAttachmentDescription.samples = local_638._8_4_;
    colorAttachmentDescription.loadOp = local_638._12_4_;
    local_638._0_8_ = 0;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)0x0;
    VStack_620.m_internal = 0;
    if (pTVar3->_vptr_TestInstance != (_func_int **)0x0) {
      viewportStateParams._0_8_ = pTVar3->_vptr_TestInstance;
      (*(code *)(pTVar14[0x2d].m_context)->m_testCtx[6].m_platform)
                (pTVar14[0x2d].m_context,pTVar14[0x2e]._vptr_TestInstance,pTVar14[0x2e].m_context,1)
      ;
    }
    *(VkAttachmentStoreOp *)&pTVar14[0x2e]._vptr_TestInstance = colorAttachmentDescription.storeOp;
    *(VkAttachmentLoadOp *)((long)&pTVar14[0x2e]._vptr_TestInstance + 4) =
         colorAttachmentDescription.stencilLoadOp;
    *(VkAttachmentStoreOp *)&pTVar14[0x2e].m_context = colorAttachmentDescription.stencilStoreOp;
    *(VkImageLayout *)((long)&pTVar14[0x2e].m_context + 4) =
         colorAttachmentDescription.initialLayout;
    *(VkAttachmentDescriptionFlags *)&pTVar3->_vptr_TestInstance = colorAttachmentDescription.flags;
    *(VkFormat *)((long)&pTVar14[0x2d]._vptr_TestInstance + 4) = colorAttachmentDescription.format;
    *(VkSampleCountFlagBits *)&pTVar14[0x2d].m_context = colorAttachmentDescription.samples;
    *(VkAttachmentLoadOp *)((long)&pTVar14[0x2d].m_context + 4) = colorAttachmentDescription.loadOp;
    if (local_638._0_8_ != 0) {
      colorAttachmentDescription.flags = local_638._0_4_;
      colorAttachmentDescription.format = local_638._4_4_;
      (*(*(_func_int ***)local_638._8_8_)[0x48])(local_638._8_8_,local_628,VStack_620.m_internal,1);
    }
    VVar13 = (*vk->_vptr_DeviceInterface[0x49])(vk,pTVar3->_vptr_TestInstance,&rasterStateParams);
    ::vk::checkResult(VVar13,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                      ,0x2e0);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,pTVar3->_vptr_TestInstance,1,0x80,0,0,0,0,0,1,&formatProps);
    (*vk->_vptr_DeviceInterface[0x74])(vk,pTVar3->_vptr_TestInstance,&renderPassParams,0);
    pp_Var10 = pTVar14[0x1f]._vptr_TestInstance;
    pCVar22 = pTVar14[0x1e].m_context;
    lVar25 = 0x230;
    lVar19 = 0;
    do {
      colorAttachmentDescription._0_8_ = lVar19;
      (*vk->_vptr_DeviceInterface[0x4c])
                (vk,pTVar14[0x2d]._vptr_TestInstance,0,
                 *(undefined8 *)((long)&pTVar14->_vptr_TestInstance + lVar25));
      (*vk->_vptr_DeviceInterface[0x58])
                (vk,pTVar3->_vptr_TestInstance,0,1,ppCVar1,&colorAttachmentDescription);
      (*vk->_vptr_DeviceInterface[0x59])
                (vk,pTVar14[0x2d]._vptr_TestInstance,
                 (ulong)((long)pTVar14[0x1f]._vptr_TestInstance - (long)pTVar14[0x1e].m_context) >>
                 7,1,0,0);
      lVar25 = lVar25 + 0x20;
      lVar19 = lVar19 + ((long)pp_Var10 - (long)pCVar22 >> 2 & 0xffffffffffffffe0U);
    } while (lVar25 != 0x2b0);
    (*vk->_vptr_DeviceInterface[0x76])(vk,pTVar3->_vptr_TestInstance);
    VVar13 = (*vk->_vptr_DeviceInterface[0x4a])(vk,pTVar3->_vptr_TestInstance);
    ::vk::checkResult(VVar13,"vk.endCommandBuffer(*m_cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                      ,0x2f3);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&renderPassParams,vk,device,0,
                      (VkAllocationCallbacks *)0x0);
    local_558._M_allocated_capacity._0_4_ = renderPassParams.flags;
    local_558._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
    local_558._8_8_ = renderPassParams.pAttachments;
    formatProps.linearTilingFeatures = renderPassParams.sType;
    formatProps.optimalTilingFeatures = renderPassParams._4_4_;
    stack0xfffffffffffffaa0 = (Context *)renderPassParams.pNext;
    renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassParams._4_4_ = 0;
    renderPassParams.pNext = (void *)0x0;
    renderPassParams.flags = 0;
    renderPassParams.attachmentCount = 0;
    renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
    obj_02.m_internal = (deUint64)pTVar14[0x2f]._vptr_TestInstance;
    if (obj_02.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&pTVar14[0x2f].m_context,obj_02);
    }
    pTVar14[0x30]._vptr_TestInstance = (_func_int **)local_558._M_allocated_capacity;
    pTVar14[0x30].m_context = (Context *)local_558._8_8_;
    pTVar14[0x2f]._vptr_TestInstance = (_func_int **)formatProps._0_8_;
    pTVar14[0x2f].m_context = stack0xfffffffffffffaa0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&renderPassParams.pNext,
                 (VkFence)renderPassParams._0_8_);
    }
    return pTVar14;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  renderPassParams._0_8_ = &renderPassParams.flags;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&renderPassParams,"Unsupported color blending format: ","");
  ::vk::getFormatName(*(VkFormat *)&pTVar14[9].m_context);
  plVar18 = (long *)std::__cxx11::string::append((char *)&renderPassParams);
  formatProps._0_8_ = *plVar18;
  psVar21 = (size_type *)(plVar18 + 2);
  if ((size_type *)formatProps._0_8_ == psVar21) {
    local_558._M_allocated_capacity = *psVar21;
    local_558._8_8_ = plVar18[3];
    formatProps._0_8_ = &local_558;
  }
  else {
    local_558._M_allocated_capacity = *psVar21;
  }
  unique0x00012000 = (Context *)plVar18[1];
  *plVar18 = (long)psVar21;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&formatProps);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* BlendTest::createInstance(Context& context) const
{
	return new BlendTestInstance(context, m_colorFormat, m_blendStates);
}